

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int archive_read_support_format_mtree(archive *_a)

{
  int iVar1;
  void *format_data;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_mtree");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    format_data = calloc(1,0x2098);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate mtree data");
    }
    else {
      *(undefined4 *)((long)format_data + 0x30) = 0xffffffff;
      iVar1 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"mtree",mtree_bid,
                         archive_read_format_mtree_options,read_header,read_data,skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,cleanup,
                         (_func_int_archive_read_ptr *)0x0,(_func_int_archive_read_ptr *)0x0);
      iVar2 = 0;
      if (iVar1 != 0) {
        free(format_data);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_format_mtree(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct mtree *mtree;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_mtree");

	mtree = (struct mtree *)calloc(1, sizeof(*mtree));
	if (mtree == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate mtree data");
		return (ARCHIVE_FATAL);
	}
	mtree->fd = -1;

	r = __archive_read_register_format(a, mtree, "mtree",
           mtree_bid, archive_read_format_mtree_options, read_header, read_data, skip, NULL, cleanup, NULL, NULL);

	if (r != ARCHIVE_OK)
		free(mtree);
	return (ARCHIVE_OK);
}